

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict sexp_closedir_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  long lVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  
  lVar1 = CONCAT71(in_register_00000009,in_CL);
  if ((*(byte *)(lVar1 + 5) >> 1 & 1) != 0) {
    closedir(*(DIR **)(lVar1 + 0x18));
    *(byte *)(lVar1 + 5) = *(byte *)(lVar1 + 5) & 0xfd;
  }
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_closedir_stub (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  if (sexp_cpointer_freep(x)) {
    closedir(
#ifdef __cplusplus
(DIR*)
#endif
sexp_cpointer_value(x));
    sexp_cpointer_freep(x) = 0;
  }
  return SEXP_VOID;
}